

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabor.h
# Opt level: O1

void __thiscall gimage::GaborKernel::set(GaborKernel *this,float s,float l,float t,float g,float p)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long i;
  long lVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  
  if (s <= 0.5) {
    s = 0.5;
  }
  lVar7 = (long)(int)((int)(s * 5.0 + 0.5) | 1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->re,lVar7,lVar7,1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->im,lVar7,lVar7,1);
  lVar7 = (this->re).height;
  if (lVar7 < 1) {
    fVar13 = 0.0;
    fVar14 = 0.0;
  }
  else {
    pfVar4 = **(this->im).img;
    pfVar8 = **(this->re).img;
    uVar1 = (this->re).height;
    lVar2 = (long)(int)((ulong)(this->re).width >> 1);
    fVar13 = 0.0;
    fVar14 = 0.0;
    lVar5 = 0;
    do {
      if (0 < (this->re).width) {
        dVar16 = (double)(lVar5 - (int)(uVar1 >> 1));
        lVar6 = 0;
        lVar3 = 0;
        lVar7 = lVar2;
        do {
          fVar9 = sinf(t);
          fVar10 = cosf(t);
          dVar15 = (double)(lVar3 - lVar2) * (double)fVar10 + dVar16 * (double)fVar9;
          dVar11 = (double)lVar7 * (double)fVar9 + (double)fVar10 * dVar16;
          dVar11 = exp(-(dVar15 * dVar15 + dVar11 * (double)(g * g) * dVar11) /
                       (double)((s + s) * s));
          dVar15 = (dVar15 * 6.283185307179586) / (double)l + (double)p;
          dVar12 = cos(dVar15);
          pfVar8[lVar3] = (float)(dVar12 * dVar11);
          dVar15 = sin(dVar15);
          pfVar4[lVar3] = (float)(dVar15 * dVar11);
          fVar13 = fVar13 + ABS((float)(dVar15 * dVar11));
          fVar14 = fVar14 + ABS(pfVar8[lVar3]);
          lVar3 = lVar3 + 1;
          lVar6 = lVar6 + -4;
          lVar7 = lVar7 + -1;
        } while (lVar3 < (this->re).width);
        pfVar8 = (float *)((long)pfVar8 - lVar6);
        pfVar4 = (float *)((long)pfVar4 - lVar6);
      }
      lVar5 = lVar5 + 1;
      lVar7 = (this->re).height;
    } while (lVar5 < lVar7);
  }
  if (0 < lVar7) {
    pfVar4 = **(this->im).img;
    lVar2 = (this->re).width;
    pfVar8 = **(this->re).img;
    lVar5 = 0;
    do {
      if (0 < lVar2) {
        lVar3 = 0;
        lVar6 = 0;
        do {
          pfVar8[lVar6] = pfVar8[lVar6] / fVar14;
          pfVar4[lVar6] = pfVar4[lVar6] / fVar13;
          lVar6 = lVar6 + 1;
          lVar3 = lVar3 + -4;
        } while (lVar2 != lVar6);
        pfVar8 = (float *)((long)pfVar8 - lVar3);
        pfVar4 = (float *)((long)pfVar4 - lVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar7);
  }
  return;
}

Assistant:

void set(float s, float l, float t, float g=1, float p=0)
    {
      s=std::max(0.5f, s);

      int kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      re.setSize(kn, kn, 1);
      im.setSize(kn, kn, 1);

      int w2=re.getWidth()>>1;
      int h2=re.getHeight()>>1;

      // compute kernels for real and imaginary part

      float re_sum=0;
      float im_sum=0;

      float *rep=re.getPtr(0, 0, 0);
      float *imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          double st=std::sin(t);
          double ct=std::cos(t);

          double a=(i-w2)*ct+(k-h2)*st;
          double b=-(i-w2)*st+(k-h2)*ct;

          double gs=std::exp(-(a*a+g*g*b*b)/(2*s*s));

          a=2*gmath::pi*a/l+p;

          *rep=static_cast<float>(gs*std::cos(a));
          *imp=static_cast<float>(gs*std::sin(a));

          re_sum+=std::abs(*rep++);
          im_sum+=std::abs(*imp++);
        }
      }

      // normalization of kernal to absolute sum of 1

      rep=re.getPtr(0, 0, 0);
      imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          *rep++/=re_sum;
          *imp++/=im_sum;
        }
      }
    }